

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O2

void __thiscall
BVSparse<Memory::HeapAllocator>::Set(BVSparse<Memory::HeapAllocator> *this,BVIndex i)

{
  SparseBVUnit *this_00;
  
  this_00 = BitsFromIndex(this,i,true);
  BVUnitT<unsigned_long>::Set(this_00,i & 0x3f);
  return;
}

Assistant:

void
BVSparse<TAllocator>::Set(BVIndex i)
{
    this->BitsFromIndex(i)->Set(SparseBVUnit::Offset(i));
}